

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O1

void NoAction<int>(void)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  char *__s;
  int iVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[",1);
  __s = _put + (*_put == '*');
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"no action",9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"... ",4);
  std::ostream::flush();
  iVar6 = 0;
  lVar3 = std::chrono::_V2::steady_clock::now();
  do {
    NoAction<int>::dummy = iVar6 + -0x80000000;
    iVar6 = iVar6 + 1;
  } while (iVar6 != -1);
  lVar4 = std::chrono::_V2::steady_clock::now();
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar5 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"s",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return;
}

Assistant:

void NoAction()
{
    static volatile T dummy;
    PROFILING_BEGIN(T, "no action")
    dummy = i; // avoid loop optimization
    PROFILING_END()
}